

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_hash.hpp
# Opt level: O0

char * assert_hash::details::file_base_impl(char *file,char *end_of_file,uint directories)

{
  char *local_38;
  char *local_30;
  char *local_28;
  uint directories_local;
  char *end_of_file_local;
  char *file_local;
  
  local_28 = end_of_file;
  if ((directories != 0) && (end_of_file != file)) {
    if ((*end_of_file == '\\') || (*end_of_file == '/')) {
      local_30 = end_of_file;
      if (directories != 1) {
        local_30 = file_base_impl(file,end_of_file + -1,directories - 1);
      }
      local_38 = local_30;
    }
    else {
      local_38 = file_base_impl(file,end_of_file + -1,directories);
    }
    local_28 = local_38;
  }
  return local_28;
}

Assistant:

constexpr const char* file_base_impl( const char* const file, const char* const end_of_file, const unsigned directories )
        {
            return directories == 0 || end_of_file == file
                ? end_of_file
                : ( *end_of_file == '\\' || *end_of_file == '/'
                    ? (
                        directories == 1
                            ? end_of_file
                            : file_base_impl( file, end_of_file - 1, directories - 1 )
                    )
                    : file_base_impl( file, end_of_file - 1, directories )
                );
        }